

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_fp32_to_fp16_row(float *x,ggml_fp16_t *y,int64_t n)

{
  float fVar1;
  long lVar2;
  ushort uVar3;
  anon_union_4_2_5fd15f10 fp32;
  float fVar4;
  anon_union_4_2_5fd15f10 fp32_1;
  
  if (0 < n) {
    lVar2 = 0;
    do {
      fVar1 = x[lVar2];
      fVar4 = (float)(((uint)fVar1 & 0x7f800000) + 0x7800000);
      if ((uint)((int)fVar1 * 2) < 0x71000000) {
        fVar4 = 2.0;
      }
      fVar4 = fVar4 + ABS(fVar1) * 5.192297e+33 * 7.70372e-34;
      uVar3 = (SUB42(fVar4,0) & 0xfff) + ((ushort)((uint)fVar4 >> 0xd) & 0x7c00);
      if (0xff000000 < (uint)((int)fVar1 * 2)) {
        uVar3 = 0x7e00;
      }
      y[lVar2] = uVar3 | (ushort)((uint)fVar1 >> 0x10) & 0x8000;
      lVar2 = lVar2 + 1;
    } while (n != lVar2);
  }
  return;
}

Assistant:

void ggml_fp32_to_fp16_row(const float * x, ggml_fp16_t * y, int64_t n) {
    int64_t i = 0;
#if defined(__F16C__)
    //if (ggml_cpu_has_f16c()) {
        for (; i + 7 < n; i += 8) {
            __m256 x_vec = _mm256_loadu_ps(x + i);
            __m128i y_vec = _mm256_cvtps_ph(x_vec, _MM_FROUND_TO_NEAREST_INT);
            _mm_storeu_si128((__m128i *)(y + i), y_vec);
        }
        for(; i + 3 < n; i += 4) {
            __m128 x_vec = _mm_loadu_ps(x + i);
            __m128i y_vec = _mm_cvtps_ph(x_vec, _MM_FROUND_TO_NEAREST_INT);
            _mm_storel_epi64((__m128i *)(y + i), y_vec);
        }
    //}
#endif
    for (; i < n; i++) {
        y[i] = GGML_FP32_TO_FP16(x[i]);
    }
}